

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O0

string * getFileLines(string *__return_storage_ptr__,string *filename,long lineStart,
                     size_t lineCount)

{
  bool bVar1;
  long lVar2;
  istream *piVar3;
  ostream *poVar4;
  long local_400;
  long i_1;
  string line;
  stringstream rtn;
  undefined1 local_3c8 [376];
  int local_250;
  int i;
  fpos<__mbstate_t> local_240;
  istream local_230 [8];
  ifstream file;
  size_t lineCount_local;
  long lineStart_local;
  string *filename_local;
  
  std::ifstream::ifstream(local_230,(string *)filename,_S_in);
  std::fpos<__mbstate_t>::fpos(&local_240,0);
  std::istream::seekg(local_230,local_240._M_off,local_240._M_state);
  for (local_250 = 0; (long)local_250 < lineStart + -1; local_250 = local_250 + 1) {
    lVar2 = std::numeric_limits<long>::max();
    std::istream::ignore((long)local_230,(int)lVar2);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)(line.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&i_1);
  for (local_400 = lineStart; local_400 < (long)(lineStart + lineCount); local_400 = local_400 + 1)
  {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (local_230,(string *)&i_1);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (bVar1) {
      poVar4 = (ostream *)std::ostream::operator<<(local_3c8,local_400);
      poVar4 = std::operator<<(poVar4,"\t|");
      poVar4 = std::operator<<(poVar4,(string *)&i_1);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string((string *)&i_1);
  std::__cxx11::stringstream::~stringstream((stringstream *)(line.field_2._M_local_buf + 8));
  std::ifstream::~ifstream(local_230);
  return __return_storage_ptr__;
}

Assistant:

static std::string getFileLines(const std::string& filename, long lineStart,
                                size_t lineCount)
{
  std::ifstream file(filename);
  file.seekg(std::ios::beg);
  for (int i = 0; i < lineStart - 1; ++i) {
    file.ignore(std::numeric_limits<std::streamsize>::max(), '\n');
  }
  std::stringstream rtn;
  std::string line;
  for (auto i = lineStart; i < (long)(lineStart + lineCount); i++) {
    if (std::getline(file, line)) {
      rtn << i << "\t|" << line << std::endl;
    }
  }

  return rtn.str();
}